

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O0

void http_parser_pause(http_parser *parser,int paused)

{
  int iVar1;
  uint32_t nread;
  int paused_local;
  http_parser *parser_local;
  
  if (((*(uint *)&parser->field_0x14 >> 0x18 & 0x7f) != 0) &&
     ((*(uint *)&parser->field_0x14 >> 0x18 & 0x7f) != 0x1f)) {
    __assert_fail("0 && \"Attempting to pause parser in error state\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatzka[P]cio/lib/cio/http-parser/http_parser.c"
                  ,0x9f5,"void http_parser_pause(http_parser *, int)");
  }
  parser->nread = parser->nread;
  iVar1 = 0;
  if (paused != 0) {
    iVar1 = 0x1f;
  }
  *(uint *)&parser->field_0x14 = *(uint *)&parser->field_0x14 & 0x80ffffff | iVar1 << 0x18;
  return;
}

Assistant:

void
http_parser_pause(http_parser *parser, int paused) {
  /* Users should only be pausing/unpausing a parser that is not in an error
   * state. In non-debug builds, there's not much that we can do about this
   * other than ignore it.
   */
  if (HTTP_PARSER_ERRNO(parser) == HPE_OK ||
      HTTP_PARSER_ERRNO(parser) == HPE_PAUSED) {
    uint32_t nread = parser->nread; /* used by the SET_ERRNO macro */
    SET_ERRNO((paused) ? HPE_PAUSED : HPE_OK);
  } else {
    assert(0 && "Attempting to pause parser in error state");
  }
}